

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void colmajor_to_rowmajor<double>
               (double *X,size_t nrows,size_t ncols,
               vector<double,_std::allocator<double>_> *X_row_major)

{
  value_type vVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  size_type in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  size_t col;
  size_t row;
  ulong local_30;
  vector<double,_std::allocator<double>_> *local_28;
  
  std::vector<double,_std::allocator<double>_>::resize(in_RSI,in_RDX);
  for (local_28 = (vector<double,_std::allocator<double>_> *)0x0; local_28 < in_RSI;
      local_28 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(local_28->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
      vVar1 = *(value_type *)(in_RDI + (local_30 + (long)local_28 * in_RDX) * 8);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RCX,(size_type)
                                 ((long)&(local_28->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start +
                                 local_30 * (long)in_RSI));
      *pvVar2 = vVar1;
    }
  }
  return;
}

Assistant:

void colmajor_to_rowmajor(const real_t *restrict X, size_t nrows, size_t ncols, std::vector<double> &X_row_major)
{
    X_row_major.resize(nrows * ncols);
    for (size_t row = 0; row < nrows; row++)
        for (size_t col = 0; col < ncols; col++)
            X_row_major[row + col*nrows] = X[col + row*ncols];
}